

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

void __thiscall QSplitter::~QSplitter(QSplitter *this)

{
  undefined1 *this_00;
  
  this_00 = &this[-1].super_QFrame.super_QWidget.field_0x18;
  ~QSplitter((QSplitter *)this_00);
  operator_delete(this_00,0x28);
  return;
}

Assistant:

QSplitter::~QSplitter()
{
    Q_D(QSplitter);
#if QT_CONFIG(rubberband)
    delete d->rubberBand;
#endif
    while (!d->list.isEmpty())
        delete d->list.takeFirst();
}